

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeGetAutoVacuum(Btree *p)

{
  int local_18;
  int rc;
  Btree *p_local;
  
  sqlite3BtreeEnter(p);
  if (p->pBt->autoVacuum == '\0') {
    local_18 = 0;
  }
  else {
    local_18 = 2;
    if (p->pBt->incrVacuum == '\0') {
      local_18 = 1;
    }
  }
  sqlite3BtreeLeave(p);
  return local_18;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeGetAutoVacuum(Btree *p){
#ifdef SQLITE_OMIT_AUTOVACUUM
  return BTREE_AUTOVACUUM_NONE;
#else
  int rc;
  sqlite3BtreeEnter(p);
  rc = (
    (!p->pBt->autoVacuum)?BTREE_AUTOVACUUM_NONE:
    (!p->pBt->incrVacuum)?BTREE_AUTOVACUUM_FULL:
    BTREE_AUTOVACUUM_INCR
  );
  sqlite3BtreeLeave(p);
  return rc;
#endif
}